

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL>::reserve
          (SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL> *this,size_t count)

{
  ulong uVar1;
  pair<unsigned_int,_unsigned_int> *ppVar2;
  ulong uVar3;
  pair<unsigned_int,_unsigned_int> *__ptr;
  
  if (count >> 0x3d == 0) {
    uVar1 = this->buffer_capacity;
    if (uVar1 < count) {
      uVar3 = 8;
      if (8 < uVar1) {
        uVar3 = uVar1;
      }
      do {
        uVar1 = uVar3;
        uVar3 = uVar1 * 2;
      } while (uVar1 < count);
      if (uVar1 < 9) {
        ppVar2 = (pair<unsigned_int,_unsigned_int> *)&this->stack_storage;
      }
      else {
        ppVar2 = (pair<unsigned_int,_unsigned_int> *)malloc(uVar1 * 8);
        if (ppVar2 == (pair<unsigned_int,_unsigned_int> *)0x0) goto LAB_001c823d;
      }
      __ptr = (this->super_VectorView<std::pair<unsigned_int,_unsigned_int>_>).ptr;
      if ((ppVar2 != __ptr) &&
         ((this->super_VectorView<std::pair<unsigned_int,_unsigned_int>_>).buffer_size != 0)) {
        uVar3 = 0;
        do {
          ppVar2[uVar3] =
               (this->super_VectorView<std::pair<unsigned_int,_unsigned_int>_>).ptr[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar3 < (this->super_VectorView<std::pair<unsigned_int,_unsigned_int>_>).
                         buffer_size);
        __ptr = (this->super_VectorView<std::pair<unsigned_int,_unsigned_int>_>).ptr;
      }
      if (__ptr != (pair<unsigned_int,_unsigned_int> *)&this->stack_storage) {
        free(__ptr);
      }
      (this->super_VectorView<std::pair<unsigned_int,_unsigned_int>_>).ptr = ppVar2;
      this->buffer_capacity = uVar1;
    }
    return;
  }
LAB_001c823d:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}